

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCU.cpp
# Opt level: O2

void __thiscall kpeg::MCU::computeIDCT(MCU *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  Level LVar4;
  Logger *pLVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  Level lvl;
  Level lvl_00;
  long lVar9;
  MCU *pMVar10;
  int iVar11;
  int iVar12;
  int v;
  long lVar13;
  int u;
  long lVar14;
  double dVar15;
  double dVar16;
  float local_ac;
  MCU *local_a8;
  float Cu;
  int local_60;
  string local_50;
  
  pLVar5 = Logger::get();
  LVar4 = Logger::getLevel(pLVar5);
  if (1 < (int)LVar4) {
    pLVar5 = Logger::get();
    poVar6 = Logger::getStream(pLVar5);
    Logger::levelStr_abi_cxx11_(&local_50,(Logger *)0x2,lvl);
    poVar6 = std::operator<<(poVar6,(string *)&local_50);
    poVar6 = std::operator<<(poVar6,"[ kpeg:");
    poVar6 = std::operator<<(poVar6,"MCU.cpp");
    poVar6 = std::operator<<(poVar6,":");
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xae);
    poVar6 = std::operator<<(poVar6," ] ");
    poVar6 = std::operator<<(poVar6,"Performing IDCT on MCU: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,m_MCUCount);
    poVar6 = std::operator<<(poVar6,"...");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_a8 = this;
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    iVar11 = 1;
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        local_60 = (int)lVar9 * 2 + 1;
        local_ac = 0.0;
        pMVar10 = local_a8;
        for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
          fVar1 = *(float *)(&DAT_00129cf0 + (ulong)(lVar14 == 0) * 4);
          iVar12 = 0;
          for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
            iVar3 = (pMVar10->m_8x8block)._M_elems[0]._M_elems[0]._M_elems[lVar13];
            fVar2 = *(float *)(&DAT_00129cf0 + (ulong)(lVar13 == 0) * 4);
            dVar15 = cos((double)((int)lVar14 * local_60) * 3.141592653589793 * 0.0625);
            dVar16 = cos((double)iVar12 * 3.141592653589793 * 0.0625);
            local_ac = (float)(dVar16 * dVar15 * (double)((float)iVar3 * fVar2 * fVar1) +
                              (double)local_ac);
            iVar12 = iVar12 + iVar11;
          }
          pMVar10 = (MCU *)((pMVar10->m_8x8block)._M_elems[0]._M_elems + 1);
        }
        (this->icoeffs)._M_elems[lVar7]._M_elems[lVar9]._M_elems[lVar8] = local_ac * 0.25;
      }
      iVar11 = iVar11 + 2;
    }
    local_a8 = (MCU *)((local_a8->m_8x8block)._M_elems + 1);
  }
  pLVar5 = Logger::get();
  LVar4 = Logger::getLevel(pLVar5);
  if (1 < (int)LVar4) {
    pLVar5 = Logger::get();
    poVar6 = Logger::getStream(pLVar5);
    Logger::levelStr_abi_cxx11_(&local_50,(Logger *)0x2,lvl_00);
    poVar6 = std::operator<<(poVar6,(string *)&local_50);
    poVar6 = std::operator<<(poVar6,"[ kpeg:");
    poVar6 = std::operator<<(poVar6,"MCU.cpp");
    poVar6 = std::operator<<(poVar6,":");
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd7);
    poVar6 = std::operator<<(poVar6," ] ");
    poVar6 = std::operator<<(poVar6,"IDCT of MCU: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,m_MCUCount);
    poVar6 = std::operator<<(poVar6," complete [OK]");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void MCU::computeIDCT()
    {
        LOG(Logger::Level::DEBUG) << "Performing IDCT on MCU: " << m_MCUCount << "..." << std::endl;
        
        for ( int i = 0; i <3; ++i )
        {
            for ( int y = 0; y < 8; ++y )
            {
                for ( int x = 0; x < 8; ++x )
                {
                    float sum = 0.0;
                    
                    for ( int u = 0; u < 8; ++u )
                    //for ( int v = 0; v < 8; ++v )
                    {
                        for ( int v = 0; v < 8; ++v )
                        //for ( int u = 0; u < 8; ++u )
                        {
                            float Cu = u == 0 ? 1.0 / std::sqrt(2.0) : 1.0;
                            float Cv = v == 0 ? 1.0 / std::sqrt(2.0) : 1.0;
                            
                            sum += Cu * Cv * m_8x8block[i][u][v] * std::cos( ( 2 * x + 1 ) * u * M_PI / 16.0 ) *
                                            std::cos( ( 2 * y + 1 ) * v * M_PI / 16.0 );
                        }
                    }
                    
                    icoeffs[i][x][y] = 0.25 * sum;
                }
            }
        }
        
//         for (auto&& mat: icoeffs )
//         {
//             for ( auto&& row : mat )
//             {
//                 for ( auto&& v : row )
//                     //std::cout << std::roundl( v ) + 128 << "\t";
//                     std::cout << std::roundl( v ) << "\t";
//                 std::cout << std::endl;
//             }
//             std::cout << std::endl;
//         }

        LOG(Logger::Level::DEBUG) << "IDCT of MCU: " << m_MCUCount << " complete [OK]" << std::endl;
    }